

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archtraits.cpp
# Opt level: O1

Error asmjit::v1_14::ArchUtils::typeIdToRegSignature
                (Arch arch,TypeId typeId,TypeId *typeIdOut,OperandSignature *regSignatureOut)

{
  byte bVar1;
  TypeId *pTVar2;
  RegType *pRVar3;
  OperandSignature *pOVar4;
  undefined7 in_register_00000039;
  long lVar5;
  RegType local_3a [5];
  RegType local_35;
  uint local_34;
  
  lVar5 = (CONCAT71(in_register_00000039,arch) & 0xffffffff) * 0xd8;
  if (typeId < _kBaseStart) {
    local_3a[4] = typeId;
    pTVar2 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::TypeId,_32UL> *)(_archTraits + lVar5 + 0x94),
                        local_3a + 4);
    typeId = *pTVar2;
  }
  if (0x44 < (byte)(typeId - _kBaseStart)) {
    return 0x38;
  }
  if ((typeId & 0x7e) == _kBaseStart) {
    typeId = (typeId == _kBaseStart ^ 0x27U) + ((arch & k32BitMask) == kUnknown) * '\x02';
  }
  bVar1 = TypeUtils::_typeData[(ulong)typeId + 0x100];
  if (bVar1 == 0) {
    return 0x38;
  }
  if (typeId == _kBaseEnd) {
    return 0x3b;
  }
  if ((byte)(typeId - _kBaseStart) < 0x14) {
    local_34 = typeId - 0x20;
    pRVar3 = Support::Array<asmjit::v1_14::RegType,_32UL>::operator[]<unsigned_int>
                       ((Array<asmjit::v1_14::RegType,_32UL> *)(_archTraits + lVar5 + 0xb4),
                        &local_34);
    local_35 = *pRVar3;
    if (local_35 == kNone) {
      return (uint)((typeId & kUInt8x8) == kInt64) * 2 + 0x38;
    }
  }
  else {
    if (bVar1 < 9) {
      local_3a[3] = 0xb;
      pOVar4 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
               operator[]<asmjit::v1_14::RegType>
                         ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                          (_archTraits + lVar5 + 0x14),local_3a + 3);
      local_35 = kARM_VecD;
      if (pOVar4->_bits != 0) goto LAB_0010dcf3;
    }
    if (bVar1 < 0x11) {
      local_3a[2] = 0xc;
      pOVar4 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
               operator[]<asmjit::v1_14::RegType>
                         ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                          (_archTraits + lVar5 + 0x14),local_3a + 2);
      local_35 = kARM_VecQ;
      if (pOVar4->_bits != 0) goto LAB_0010dcf3;
    }
    if (bVar1 == 0x20) {
      local_3a[1] = 0xd;
      pOVar4 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
               operator[]<asmjit::v1_14::RegType>
                         ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                          (_archTraits + lVar5 + 0x14),local_3a + 1);
      local_35 = kVec256;
      if (pOVar4->_bits != 0) goto LAB_0010dcf3;
    }
    local_3a[0] = kVec512;
    pOVar4 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
             operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar5 + 0x14)
                        ,local_3a);
    local_35 = kVec512;
    if (pOVar4->_bits == 0) {
      return 0x38;
    }
  }
LAB_0010dcf3:
  *typeIdOut = typeId;
  pOVar4 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::operator[]<asmjit::v1_14::RegType>
                     ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + lVar5 + 0x14),
                      &local_35);
  regSignatureOut->_bits = pOVar4->_bits;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error ArchUtils::typeIdToRegSignature(Arch arch, TypeId typeId, TypeId* typeIdOut, OperandSignature* regSignatureOut) noexcept {
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  // TODO: Remove this, should never be used like this.
  // Passed RegType instead of TypeId?
  if (uint32_t(typeId) <= uint32_t(RegType::kMaxValue))
    typeId = archTraits.regTypeToTypeId(RegType(uint32_t(typeId)));

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(typeId)))
    return DebugUtils::errored(kErrorInvalidTypeId);

  // First normalize architecture dependent types.
  if (TypeUtils::isAbstract(typeId)) {
    bool is32Bit = Environment::is32Bit(arch);
    if (typeId == TypeId::kIntPtr)
      typeId = is32Bit ? TypeId::kInt32 : TypeId::kInt64;
    else
      typeId = is32Bit ? TypeId::kUInt32 : TypeId::kUInt64;
  }

  // Type size helps to construct all groups of registers.
  // TypeId is invalid if the size is zero.
  uint32_t size = TypeUtils::sizeOf(typeId);
  if (ASMJIT_UNLIKELY(!size))
    return DebugUtils::errored(kErrorInvalidTypeId);

  if (ASMJIT_UNLIKELY(typeId == TypeId::kFloat80))
    return DebugUtils::errored(kErrorInvalidUseOfF80);

  RegType regType = RegType::kNone;
  if (TypeUtils::isBetween(typeId, TypeId::_kBaseStart, TypeId::_kVec32Start)) {
    regType = archTraits._typeIdToRegType[uint32_t(typeId) - uint32_t(TypeId::_kBaseStart)];
    if (regType == RegType::kNone) {
      if (typeId == TypeId::kInt64 || typeId == TypeId::kUInt64)
        return DebugUtils::errored(kErrorInvalidUseOfGpq);
      else
        return DebugUtils::errored(kErrorInvalidTypeId);
    }
  }
  else {
    if (size <= 8 && archTraits._regSignature[RegType::kVec64].isValid())
      regType = RegType::kVec64;
    else if (size <= 16 && archTraits._regSignature[RegType::kVec128].isValid())
      regType = RegType::kVec128;
    else if (size == 32 && archTraits._regSignature[RegType::kVec256].isValid())
      regType = RegType::kVec256;
    else if (archTraits._regSignature[RegType::kVec512].isValid())
      regType = RegType::kVec512;
    else
      return DebugUtils::errored(kErrorInvalidTypeId);
  }

  *typeIdOut = typeId;
  *regSignatureOut = archTraits.regTypeToSignature(regType);
  return kErrorOk;
}